

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::expectCancel(TestMoreStuffImpl *this,ExpectCancelContext context)

{
  Client local_80;
  Reader local_68;
  undefined1 local_38 [8];
  Client cap;
  TestMoreStuffImpl *this_local;
  ExpectCancelContext context_local;
  
  cap._16_8_ = context.hook;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::getParams(&local_68,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams::Reader::getCap
            ((Client *)local_38,&local_68);
  capnproto_test::capnp::test::TestInterface::Client::Client(&local_80,(Client *)local_38);
  loop(this,(uint)context.hook,(Client *)0x0,(CallContextHook *)&local_80);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_80);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::expectCancel(ExpectCancelContext context) {
  auto cap = context.getParams().getCap();
  return loop(0, cap, context);
}